

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int act_strip(nt_opts *opts)

{
  int iVar1;
  nifti_image *nim_00;
  int local_24;
  int fc;
  nifti_image *nim;
  nt_opts *opts_local;
  
  if (2 < g_debug) {
    fprintf(_stderr,"+d stripping extras from %d files\n",(ulong)(uint)(opts->infiles).len);
  }
  if ((opts->prefix == (char *)0x0) || ((opts->infiles).len == 1)) {
    for (local_24 = 0; local_24 < (opts->infiles).len; local_24 = local_24 + 1) {
      nim_00 = nt_image_read(opts,(opts->infiles).list[local_24],1);
      if (nim_00 == (nifti_image *)0x0) {
        return 1;
      }
      nifti_free_extensions(nim_00);
      memset(nim_00->descrip,0,0x50);
      if ((opts->prefix != (char *)0x0) &&
         (iVar1 = nifti_set_filenames(nim_00,opts->prefix,(uint)((opts->overwrite != 0 ^ 0xffU) & 1)
                                      ,1), iVar1 != 0)) {
        nifti_image_free(nim_00);
        return 1;
      }
      if (1 < g_debug) {
        fprintf(_stderr,"+d writing %s without extensions or \'descrip\'\n",nim_00->fname);
      }
      nifti_image_write(nim_00);
      if (3 < g_debug) {
        nifti_image_infodump(nim_00);
      }
      nifti_image_free(nim_00);
    }
    if (0 < g_debug) {
      fprintf(_stderr,"+d stripped extras from %d files\n",(ulong)(uint)(opts->infiles).len);
    }
    opts_local._4_4_ = 0;
  }
  else {
    fprintf(_stderr,"** error: we have a prefix but %d files\n",(ulong)(uint)(opts->infiles).len);
    opts_local._4_4_ = 1;
  }
  return opts_local._4_4_;
}

Assistant:

int act_strip( nt_opts * opts )
{
   nifti_image      * nim;
   int                fc;

   if( g_debug > 2 )
      fprintf(stderr,"+d stripping extras from %d files\n", opts->infiles.len);

   if( opts->prefix && opts->infiles.len != 1 ){
      fprintf(stderr,"** error: we have a prefix but %d files\n",
              opts->infiles.len);
      return 1;
   }

   for( fc = 0; fc < opts->infiles.len; fc++ )
   {
      nim = nt_image_read( opts, opts->infiles.list[fc], 1 );
      if( !nim ) return 1;  /* errors come from the library */

      /* now remove the extensions */
      nifti_free_extensions(nim);
      memset(nim->descrip, 0, 80);

      if( opts->prefix &&
          nifti_set_filenames(nim, opts->prefix, !opts->overwrite, 1) ){
         nifti_image_free(nim);
         return 1;
      }

      if( g_debug > 1 )
         fprintf(stderr,"+d writing %s without extensions or 'descrip'\n",
                 nim->fname);

      nifti_image_write(nim);

      if( g_debug > 3 ) nifti_image_infodump(nim);
      nifti_image_free(nim);
   }

   if( g_debug > 0 )
      fprintf(stderr,"+d stripped extras from %d files\n", opts->infiles.len);

   return 0;
}